

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O0

void DUI_Update(void)

{
  uint uVar1;
  bool bVar2;
  _Bool pressed;
  int state;
  byte local_6;
  
  uVar1 = SDL_GetMouseState(&_duiMouse,0x198fe4);
  bVar2 = (uVar1 & 1) != 0;
  local_6 = 0;
  if (bVar2) {
    local_6 = _duiMouseDown ^ 0xff;
  }
  _duiClicked = (_Bool)(local_6 & 1);
  _duiMouseDown = bVar2;
  return;
}

Assistant:

void DUI_Update()
{
    int state = SDL_GetMouseState(&_duiMouse.x, &_duiMouse.y);
    bool pressed = (state & SDL_BUTTON(SDL_BUTTON_LEFT));
    _duiClicked = (pressed && !_duiMouseDown);
    _duiMouseDown = pressed;
}